

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QSet<QtGraphicsAnchorLayout::AnchorData_*> * __thiscall
QSet<QtGraphicsAnchorLayout::AnchorData_*>::intersect
          (QSet<QtGraphicsAnchorLayout::AnchorData_*> *this,
          QSet<QtGraphicsAnchorLayout::AnchorData_*> *other)

{
  bool bVar1;
  anon_class_8_1_a86c6e30 in_RSI;
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *in_RDI;
  long in_FS_OFFSET;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *unaff_retaddr;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *in_stack_ffffffffffffffc8;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *rhs;
  
  rhs = *(QSet<QtGraphicsAnchorLayout::AnchorData_*> **)(in_FS_OFFSET + 0x28);
  bVar1 = QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::isSharedWith
                    (in_RDI,&(in_RSI.other)->q_hash);
  if (!bVar1) {
    bVar1 = isEmpty((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x94b699);
    if ((bVar1) || (bVar1 = isEmpty((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x94b6a7), bVar1))
    {
      clear((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x94b6b7);
    }
    else {
      bVar1 = QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::isDetached(in_RDI);
      if (bVar1) {
        QSet<QtGraphicsAnchorLayout::AnchorData*>::
        removeIf<QSet<QtGraphicsAnchorLayout::AnchorData*>::intersect(QSet<QtGraphicsAnchorLayout::AnchorData*>const&)::_lambda(QtGraphicsAnchorLayout::AnchorData*const&)_1_>
                  ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI,in_RSI);
      }
      else {
        intersected_helper(unaff_retaddr,rhs);
        operator=((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI,in_stack_ffffffffffffffc8);
        ~QSet((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x94b711);
      }
    }
  }
  if (*(QSet<QtGraphicsAnchorLayout::AnchorData_*> **)(in_FS_OFFSET + 0x28) != rhs) {
    __stack_chk_fail();
  }
  return (QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_RDI;
}

Assistant:

Q_INLINE_TEMPLATE QSet<T> &QSet<T>::intersect(const QSet<T> &other)
{
    if (q_hash.isSharedWith(other.q_hash)) {
        // nothing to do
    } else if (isEmpty() || other.isEmpty()) {
        // any set intersected with the empty set is the empty set
        clear();
    } else if (q_hash.isDetached()) {
        // do it in-place:
        removeIf([&other] (const T &e) { return !other.contains(e); });
    } else {
        // don't detach *this just to remove some items; create a new set
        *this = intersected_helper(*this, other);
    }
    return *this;
}